

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_trace_file_base.cpp
# Opt level: O3

bool __thiscall sc_core::sc_trace_file_base::add_trace_check(sc_trace_file_base *this,string *name)

{
  bool bVar1;
  ostream *poVar2;
  stringstream ss;
  char *local_1c8;
  char local_1b8 [16];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  bVar1 = this->initialized_;
  if (bVar1 == true) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,"sc_trace() failed:\n\tNo traces can be added to \'",0x2f);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_198,(this->filename_)._M_dataplus._M_p,
                        (this->filename_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"\' once trace recording has started.\n\tTo add tracing of \'",0x38);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\', create a new trace file.",0x1b);
    std::__cxx11::stringbuf::str();
    sc_report_handler::report
              (SC_ERROR,"sc_trace_file already initialized",local_1c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/tracing/sc_trace_file_base.cpp"
               ,0xf0);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8);
    }
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool
sc_trace_file_base::add_trace_check( const std::string & name ) const
{
    if( !initialized_ ) return true;

    std::stringstream ss;
    ss << "sc_trace() failed:\n"
         "\tNo traces can be added to "
         "'" << filename_  << "'"
         " once trace recording has started.\n"
         "\tTo add tracing of '" << name << "', create a new trace file.";

    SC_REPORT_ERROR( SC_ID_TRACING_ALREADY_INITIALIZED_
                   , ss.str().c_str() );
    return false;
}